

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O1

int __thiscall
Minisat::Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_>::removeMin
          (Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_> *this)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  
  piVar3 = (this->heap).data;
  iVar1 = *piVar3;
  iVar2 = piVar3[(long)(this->heap).sz + -1];
  *piVar3 = iVar2;
  if (iVar2 < (this->indices).map.sz) {
    piVar3 = (this->indices).map.data;
    piVar3[iVar2] = 0;
    if (iVar1 < (this->indices).map.sz) {
      piVar3[iVar1] = -1;
      iVar2 = (this->heap).sz;
      if (0 < iVar2) {
        (this->heap).sz = iVar2 + -1;
        if (2 < iVar2) {
          percolateDown(this,0);
        }
        return iVar1;
      }
      __assert_fail("sz > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/Vec.h"
                    ,0x4e,"void Minisat::vec<int>::pop() [T = int, _Size = int]");
    }
  }
  __assert_fail("has(k)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/IntMap.h"
                ,0x28,
                "V &Minisat::IntMap<int, int>::operator[](K) [K = int, V = int, MkIndex = Minisat::MkIndexDefault<int>]"
               );
}

Assistant:

void update(K k)
    {
        if (!inHeap(k))
            insert(k);
        else {
            percolateUp(indices[k]);
            percolateDown(indices[k]); }
    }